

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrPlaneDetectorLocationEXT *value)

{
  bool bVar1;
  NextChainResult NVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  XrResult XVar3;
  uint32_t in_stack_fffffffffffffd2c;
  allocator local_2c9;
  string local_2c8;
  string *local_2a8;
  allocator local_299;
  string local_298;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  string error_message;
  
  XVar3 = XR_SUCCESS;
  local_2a8 = command_name;
  if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATION_EXT) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrPlaneDetectorLocationEXT",value->type,
               "VUID-XrPlaneDetectorLocationEXT-type-type",XR_TYPE_PLANE_DETECTOR_LOCATION_EXT,
               "XR_TYPE_PLANE_DETECTOR_LOCATION_EXT");
  }
  if (!check_pnext) goto LAB_001b217c;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  NVar2 = ValidateNextChain(instance_info,local_2a8,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar2 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    std::__cxx11::string::string
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ",
               (allocator *)&local_2c8);
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&local_2c8,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::append((string *)&error_message);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::string
              ((string *)&local_2c8,"VUID-XrPlaneDetectorLocationEXT-next-unique",&local_2c9);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1f8,objects_info);
    std::__cxx11::string::string
              ((string *)&local_298,
               "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct"
               ,&local_299);
    CoreValidLogMessage(instance_info,&local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2a8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1f8,&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1f8);
    std::__cxx11::string::~string((string *)&local_2c8);
LAB_001b2147:
    std::__cxx11::string::~string((string *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar2 == NEXT_CHAIN_RESULT_ERROR) {
    std::__cxx11::string::string
              ((string *)&error_message,"VUID-XrPlaneDetectorLocationEXT-next-next",
               (allocator *)&local_298);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1e0,objects_info);
    std::__cxx11::string::string
              ((string *)&local_2c8,
               "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct \"next\""
               ,&local_2c9);
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2a8,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1e0,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1e0);
    goto LAB_001b2147;
  }
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&encountered_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&duplicate_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
  std::_Vector_base<XrStructureType,_std::allocator<XrStructureType>_>::~_Vector_base
            (&valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>);
LAB_001b217c:
  if (check_members && XVar3 == XR_SUCCESS) {
    if (value->locationFlags < 0x10) {
      std::__cxx11::string::string
                ((string *)&error_message,"XrPlaneDetectorLocationEXT",(allocator *)&local_298);
      std::__cxx11::string::string
                ((string *)&local_2c8,"orientation",(allocator *)&valid_ext_structs);
      bVar1 = ValidateXrEnum(instance_info,local_2a8,&error_message,&local_2c8,objects_info,
                             value->orientation);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&error_message);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&error_message,"XrPlaneDetectorLocationEXT",(allocator *)&local_298);
        std::__cxx11::string::string
                  ((string *)&local_2c8,"semanticType",(allocator *)&valid_ext_structs);
        bVar1 = ValidateXrEnum(instance_info,local_2a8,&error_message,&local_2c8,objects_info,
                               value->semanticType);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&error_message);
        if (bVar1) {
          return XR_SUCCESS;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticType\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
        std::operator<<((ostream *)&error_message,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::string
                  ((string *)&local_2c8,"VUID-XrPlaneDetectorLocationEXT-semanticType-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_240,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2a8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_240,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        this = &local_240;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::operator<<((ostream *)&error_message,
                        "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorOrientationEXT \"orientation\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
        std::operator<<((ostream *)&error_message,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::string
                  ((string *)&local_2c8,"VUID-XrPlaneDetectorLocationEXT-orientation-parameter",
                   (allocator *)&valid_ext_structs);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_228,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2a8,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&local_228,&local_298);
        std::__cxx11::string::~string((string *)&local_298);
        this = &local_228;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::operator<<((ostream *)&error_message,
                      "XrPlaneDetectorLocationEXT invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffd2c);
      std::operator<<((ostream *)&error_message,(string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::operator<<((ostream *)&error_message," contains illegal bit");
      std::__cxx11::string::string
                ((string *)&local_2c8,"VUID-XrPlaneDetectorLocationEXT-locationFlags-parameter",
                 (allocator *)&valid_ext_structs);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_210,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_2a8,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_210,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      this = &local_210;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar3;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrPlaneDetectorLocationEXT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_PLANE_DETECTOR_LOCATION_EXT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrPlaneDetectorLocationEXT",
                             value->type, "VUID-XrPlaneDetectorLocationEXT-type-type", XR_TYPE_PLANE_DETECTOR_LOCATION_EXT, "XR_TYPE_PLANE_DETECTOR_LOCATION_EXT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrPlaneDetectorLocationEXT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrPlaneDetectorLocationEXT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrPlaneDetectorOrientationEXT value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorLocationEXT", "orientation", objects_info, value->orientation)) {
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorOrientationEXT \"orientation\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->orientation));
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-orientation-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrPlaneDetectorSemanticTypeEXT value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrPlaneDetectorLocationEXT", "semanticType", objects_info, value->semanticType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrPlaneDetectorLocationEXT contains invalid XrPlaneDetectorSemanticTypeEXT \"semanticType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->semanticType));
        CoreValidLogMessage(instance_info, "VUID-XrPlaneDetectorLocationEXT-semanticType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}